

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O0

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
          vector<double,_std::allocator<double>_> *weights)

{
  ulong uVar1;
  size_t sVar2;
  reference pvVar3;
  undefined8 uVar4;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_RSI;
  AlphaVectorPOMDP *in_RDI;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *unaff_retaddr;
  void **in_stack_00000008;
  AlphaVectorBG *in_stack_00000010;
  Index s;
  AlphaVectorPlanning *in_stack_ffffffffffffff88;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff90;
  char *arg;
  E *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffdc;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  AlphaVectorPlanning::AlphaVectorPlanning((AlphaVectorPlanning *)this,pu);
  AlphaVectorPOMDP::AlphaVectorPOMDP(in_RDI,&PTR_construction_vtable_24__00d114a0,in_RSI);
  AlphaVectorBG::AlphaVectorBG(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  in_RDI->_vptr_AlphaVectorPOMDP = (_func_int **)&PTR__AlphaVectorWeighted_00d11438;
  *(undefined ***)&in_RDI->field_0x58 = &PTR__AlphaVectorWeighted_00d11488;
  *(undefined ***)&in_RDI->field_0x8 = &PTR__AlphaVectorWeighted_00d11460;
  in_RDI->field_0x20 = 0;
  this_00 = (E *)&in_RDI->field_0x28;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffe0,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  arg = &in_RDI->field_0x40;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x957db1);
  uVar5 = 0;
  while( true ) {
    uVar1 = (ulong)uVar5;
    AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff88);
    sVar2 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffff90);
    if (uVar1 == sVar2) {
      BackProjectWeights((AlphaVectorWeighted *)in_stack_00000010);
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
                        (size_type)in_stack_ffffffffffffff88);
    if (*pvVar3 < 0.0) break;
    in_stack_ffffffffffffff90 =
         (PlanningUnitMADPDiscrete *)
         std::vector<double,_std::allocator<double>_>::at
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
                    (size_type)in_stack_ffffffffffffff88);
    if (1.0 < (double)(in_stack_ffffffffffffff90->super_PlanningUnit)._vptr_PlanningUnit) break;
    uVar5 = uVar5 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  E::E(this_00,arg);
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                    std::vector<double> weights) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_initialized(false),
    _m_weights(weights)
{
    for(Index s=0;s!=GetPU()->GetNrStates();++s)
        if(_m_weights.at(s) < 0 || _m_weights.at(s) > 1)
            throw(E("AlphaVectorWeighted ctor: weights should be >=0 and <=1"));
    BackProjectWeights();
}